

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O1

void Acb_DeriveCnfForNode(Acb_Ntk_t *p,int iObj,sat_solver *pSat,int OutVar)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  Vec_Int_t *vClas;
  int *piVar5;
  Vec_Int_t *vLits;
  long lVar6;
  char *__assertion;
  long lVar7;
  
  vClas = (Vec_Int_t *)malloc(0x10);
  vClas->nCap = 100;
  vClas->nSize = 0;
  piVar5 = (int *)malloc(400);
  vClas->pArray = piVar5;
  vLits = (Vec_Int_t *)malloc(0x10);
  vLits->nCap = 100;
  vLits->nSize = 0;
  piVar5 = (int *)malloc(400);
  vLits->pArray = piVar5;
  (p->vCover).nSize = 0;
  if (iObj < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                  ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
  }
  if (iObj < (p->vObjFans).nSize) {
    iVar1 = (p->vObjFans).pArray[(uint)iObj];
    lVar6 = (long)iVar1;
    if ((lVar6 < 0) || ((p->vFanSto).nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    p_00 = &p->vCover;
    piVar5 = (p->vFanSto).pArray;
    if (0 < piVar5[lVar6]) {
      lVar7 = 0;
      do {
        iVar1 = piVar5[lVar6 + lVar7 + 1];
        if ((long)iVar1 < 1) {
          __assertion = "i>0";
LAB_003a0a9d:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                        ,0x109,"int Acb_ObjFunc(Acb_Ntk_t *, int)");
        }
        iVar4 = (p->vObjFunc).nSize;
        if (iVar4 < 1) {
          __assertion = "Acb_NtkHasObjFuncs(p)";
          goto LAB_003a0a9d;
        }
        if (iVar4 <= iVar1) goto LAB_003a0a4f;
        iVar1 = (p->vObjFunc).pArray[iVar1];
        if (iVar1 < 0) {
          __assert_fail("Acb_ObjFunc(p, iFanin) >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                        ,0xad,"void Acb_DeriveCnfForNode(Acb_Ntk_t *, int, sat_solver *, int)");
        }
        lVar7 = lVar7 + 1;
        Vec_IntPush(p_00,iVar1);
      } while (lVar7 < piVar5[lVar6]);
    }
    Vec_IntPush(p_00,OutVar);
    if (iObj < (p->vCnfs).nSize) {
      Acb_TranslateCnf(vClas,vLits,(Vec_Str_t *)((p->vCnfs).pArray + (uint)iObj),p_00,-1);
      iVar1 = vClas->nSize;
      if (0 < (long)iVar1) {
        piVar5 = vClas->pArray;
        piVar3 = vLits->pArray;
        lVar6 = 0;
        iVar4 = 0;
        do {
          iVar2 = piVar5[lVar6];
          iVar4 = sat_solver_addclause(pSat,piVar3 + iVar4,piVar3 + iVar2);
          if (iVar4 == 0) {
            puts("Error: SAT solver became UNSAT at a wrong place (while adding new CNF).");
          }
          lVar6 = lVar6 + 1;
          iVar4 = iVar2;
        } while (iVar1 != lVar6);
      }
      if (vClas->pArray != (int *)0x0) {
        free(vClas->pArray);
        vClas->pArray = (int *)0x0;
      }
      free(vClas);
      if (vLits->pArray != (int *)0x0) {
        free(vLits->pArray);
        vLits->pArray = (int *)0x0;
      }
      free(vLits);
      return;
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
LAB_003a0a4f:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Acb_DeriveCnfForNode( Acb_Ntk_t * p, int iObj, sat_solver * pSat, int OutVar )
{
    Vec_Wec_t * vCnfs = &p->vCnfs;
    Vec_Int_t * vFaninVars = &p->vCover;
    Vec_Int_t * vClas = Vec_IntAlloc( 100 );
    Vec_Int_t * vLits = Vec_IntAlloc( 100 );
    int k, iFanin, * pFanins, Prev, This;
    // collect SAT variables
    Vec_IntClear( vFaninVars );
    Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, k )
    {
        assert( Acb_ObjFunc(p, iFanin) >= 0 );
        Vec_IntPush( vFaninVars, Acb_ObjFunc(p, iFanin) );
    }
    Vec_IntPush( vFaninVars, OutVar );
    // derive CNF for the node
    Acb_TranslateCnf( vClas, vLits, (Vec_Str_t *)Vec_WecEntry(vCnfs, iObj), vFaninVars, -1 );
    // add clauses
    Prev = 0;
    Vec_IntForEachEntry( vClas, This, k )
    {
        if ( !sat_solver_addclause( pSat, Vec_IntArray(vLits) + Prev, Vec_IntArray(vLits) + This ) )
            printf( "Error: SAT solver became UNSAT at a wrong place (while adding new CNF).\n" );
        Prev = This;
    }
    Vec_IntFree( vClas );
    Vec_IntFree( vLits );
}